

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

void xmlCatalogConvertEntry(void *payload,void *data,xmlChar *name)

{
  xmlHashTablePtr table;
  long lVar1;
  long *plVar2;
  uint uVar3;
  long *plVar4;
  
  if (((data != (void *)0x0 && payload != (void *)0x0) &&
      (table = *(xmlHashTablePtr *)((long)data + 0x60), table != (xmlHashTablePtr)0x0)) &&
     (*(long *)((long)data + 0x70) != 0)) {
    uVar3 = *(int *)((long)payload + 0x18) - 0xd;
    if ((9 < uVar3) || ((0x2ffU >> (uVar3 & 0x1f) & 1) == 0)) {
      xmlHashRemoveEntry(table,*(xmlChar **)((long)payload + 0x20),xmlFreeCatalogEntry);
      return;
    }
    *(undefined4 *)((long)payload + 0x18) = *(undefined4 *)(&DAT_001ef890 + (ulong)uVar3 * 4);
    xmlHashRemoveEntry(table,*(xmlChar **)((long)payload + 0x20),(xmlHashDeallocator)0x0);
    lVar1 = *(long *)((long)data + 0x70);
    *(long *)((long)payload + 8) = lVar1;
    *(undefined8 *)payload = 0;
    plVar2 = *(long **)(lVar1 + 0x10);
    if (*(long **)(lVar1 + 0x10) == (long *)0x0) {
      *(void **)(lVar1 + 0x10) = payload;
    }
    else {
      do {
        plVar4 = plVar2;
        plVar2 = (long *)*plVar4;
      } while (plVar2 != (long *)0x0);
      *plVar4 = (long)payload;
    }
  }
  return;
}

Assistant:

static void
xmlCatalogConvertEntry(void *payload, void *data,
                       const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlCatalogEntryPtr entry = (xmlCatalogEntryPtr) payload;
    xmlCatalogPtr catal = (xmlCatalogPtr) data;
    if ((entry == NULL) || (catal == NULL) || (catal->sgml == NULL) ||
	(catal->xml == NULL))
	return;
    switch (entry->type) {
	case SGML_CATA_ENTITY:
	    entry->type = XML_CATA_PUBLIC;
	    break;
	case SGML_CATA_PENTITY:
	    entry->type = XML_CATA_PUBLIC;
	    break;
	case SGML_CATA_DOCTYPE:
	    entry->type = XML_CATA_PUBLIC;
	    break;
	case SGML_CATA_LINKTYPE:
	    entry->type = XML_CATA_PUBLIC;
	    break;
	case SGML_CATA_NOTATION:
	    entry->type = XML_CATA_PUBLIC;
	    break;
	case SGML_CATA_PUBLIC:
	    entry->type = XML_CATA_PUBLIC;
	    break;
	case SGML_CATA_SYSTEM:
	    entry->type = XML_CATA_SYSTEM;
	    break;
	case SGML_CATA_DELEGATE:
	    entry->type = XML_CATA_DELEGATE_PUBLIC;
	    break;
	case SGML_CATA_CATALOG:
	    entry->type = XML_CATA_CATALOG;
	    break;
	default:
	    xmlHashRemoveEntry(catal->sgml, entry->name, xmlFreeCatalogEntry);
	    return;
    }
    /*
     * Conversion successful, remove from the SGML catalog
     * and add it to the default XML one
     */
    xmlHashRemoveEntry(catal->sgml, entry->name, NULL);
    entry->parent = catal->xml;
    entry->next = NULL;
    if (catal->xml->children == NULL)
	catal->xml->children = entry;
    else {
	xmlCatalogEntryPtr prev;

	prev = catal->xml->children;
	while (prev->next != NULL)
	    prev = prev->next;
	prev->next = entry;
    }
}